

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O1

void tap_skip(int n,char *fmt,...)

{
  char in_AL;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.overflow_arg_area = &args[0].overflow_arg_area;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  __ptr = vstrdupf(fmt,&local_f8);
  if (0 < n) {
    iVar1 = n + 1;
    do {
      current_test = current_test + 1;
      printf("ok %d ");
      diag("skip %s\n",__ptr);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  free(__ptr);
  return;
}

Assistant:

void
tap_skip (int n, const char *fmt, ...) {
    char *why;
    va_list args;
    va_start(args, fmt);
    why = vstrdupf(fmt, args);
    va_end(args);
    while (n --> 0) {
        printf("ok %d ", ++current_test);
        diag("skip %s\n", why);
    }
    free(why);
}